

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O0

MppTrieNode * mpp_trie_get_node(MppTrieNode *root,char *name)

{
  byte bVar1;
  char cVar2;
  uint local_60;
  char *local_58;
  RK_S32 end;
  RK_U32 key1;
  RK_U32 key0;
  RK_S32 RStack_3c;
  RK_U8 key;
  RK_S32 idx;
  RK_S32 tag_len;
  RK_U64 tag_val;
  char *s;
  MppTrieNode *ret;
  char *name_local;
  MppTrieNode *root_local;
  
  s = (char *)0x0;
  _idx = 0;
  RStack_3c = 0;
  key0 = 0;
  tag_val = (RK_U64)name;
  ret = (MppTrieNode *)name;
  name_local = (char *)root;
  if ((root == (MppTrieNode *)0x0) || (name == (char *)0x0)) {
    _mpp_log_l(2,"mpp_trie","invalid root %p name %p\n","mpp_trie_get_node",root,name);
    root_local = (MppTrieNode *)0x0;
  }
  else {
    if ((mpp_trie_debug & 4) != 0) {
      _mpp_log_l(4,"mpp_trie","root %p search %s start\n","mpp_trie_get_node",root,name);
    }
    do {
      bVar1 = *(byte *)tag_val;
      cVar2 = *(char *)(tag_val + 1);
      tag_val = tag_val + 1;
      key0 = mpp_trie_walk((MppTrieNode *)(name_local + (long)(int)key0 * 0x38),(RK_U64 *)&idx,
                           &stack0xffffffffffffffc4,(int)(uint)bVar1 >> 4);
      if (((int)key0 < 0) ||
         (key0 = mpp_trie_walk((MppTrieNode *)(name_local + (long)(int)key0 * 0x38),(RK_U64 *)&idx,
                               &stack0xffffffffffffffc4,bVar1 & 0xf), (int)key0 < 0)) break;
    } while (cVar2 != '\0');
    if ((int)key0 < 0) {
      local_58 = (char *)0x0;
    }
    else {
      local_58 = name_local + (long)(int)key0 * 0x38;
    }
    s = local_58;
    if ((mpp_trie_debug & 4) != 0) {
      if (local_58 == (char *)0x0) {
        local_60 = 0xffffffff;
      }
      else {
        local_60 = *(uint *)(local_58 + 0x20);
      }
      _mpp_log_l(4,"mpp_trie","get node %d:%d\n","mpp_trie_get_node",(ulong)key0,(ulong)local_60);
    }
    root_local = (MppTrieNode *)s;
  }
  return root_local;
}

Assistant:

static MppTrieNode *mpp_trie_get_node(MppTrieNode *root, const char *name)
{
    MppTrieNode *ret = NULL;
    const char *s = name;
    RK_U64 tag_val = 0;
    RK_S32 tag_len = 0;
    RK_S32 idx = 0;

    if (!root || !name) {
        mpp_err_f("invalid root %p name %p\n", root, name);
        return NULL;
    }

    trie_dbg_get("root %p search %s start\n", root, name);

    do {
        RK_U8 key = *s++;
        RK_U32 key0 = (key >> 4) & 0xf;
        RK_U32 key1 = key & 0xf;
        RK_S32 end = (s[0] == '\0');

        idx = mpp_trie_walk(&root[idx], &tag_val, &tag_len, key0);
        if (idx < 0)
            break;

        idx = mpp_trie_walk(&root[idx], &tag_val, &tag_len, key1);
        if (idx < 0 || end)
            break;
    } while (1);

    ret = (idx >= 0) ? &root[idx] : NULL;

    trie_dbg_get("get node %d:%d\n", idx, ret ? ret->id : INVALID_NODE_ID);

    return ret;
}